

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_helper.h
# Opt level: O0

int __thiscall spdlog::details::file_helper::open(file_helper *this,char *__file,int __oflag,...)

{
  char *pcVar1;
  undefined8 uVar2;
  filename_t *filename;
  int tries;
  char *mode;
  int iStack0000000000000184;
  undefined8 in_stack_00000180;
  string *in_stack_00000188;
  spdlog_ex *in_stack_00000190;
  undefined4 in_stack_ffffffffffffff00;
  undefined2 in_stack_ffffffffffffff04;
  byte in_stack_ffffffffffffff06;
  undefined1 in_stack_ffffffffffffff07;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff08;
  string *fp;
  char *local_d8;
  allocator local_49;
  string local_48 [36];
  int local_24;
  char *local_20;
  byte local_11;
  string *local_10;
  file_helper *local_8;
  
  iStack0000000000000184 = (int)((ulong)in_stack_00000180 >> 0x20);
  local_11 = (byte)__oflag & 1;
  local_10 = (string *)__file;
  local_8 = this;
  close(this,(int)__file);
  if ((local_11 & 1) == 0) {
    local_d8 = "ab";
  }
  else {
    local_d8 = "wb";
  }
  local_20 = local_d8;
  std::__cxx11::string::operator=((string *)&this->_filename,local_10);
  local_24 = 0;
  while( true ) {
    pcVar1 = local_20;
    if (this->open_tries <= local_24) {
      filename = (filename_t *)__cxa_allocate_exception(0x28);
      os::filename_to_str(filename);
      std::operator+((char *)in_stack_ffffffffffffff08,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT17(in_stack_ffffffffffffff07,
                              CONCAT16(in_stack_ffffffffffffff06,
                                       CONCAT24(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00)
                                      )));
      std::operator+(in_stack_ffffffffffffff08,
                     (char *)CONCAT17(in_stack_ffffffffffffff07,
                                      CONCAT16(in_stack_ffffffffffffff06,
                                               CONCAT24(in_stack_ffffffffffffff04,
                                                        in_stack_ffffffffffffff00))));
      __errno_location();
      spdlog_ex::spdlog_ex(in_stack_00000190,in_stack_00000188,iStack0000000000000184);
      __cxa_throw(filename,&spdlog_ex::typeinfo,spdlog_ex::~spdlog_ex);
    }
    in_stack_ffffffffffffff08 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&this->fd_;
    fp = local_10;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_48,pcVar1,&local_49);
    in_stack_ffffffffffffff07 =
         os::fopen_s((FILE **)fp,in_stack_ffffffffffffff08,
                     (filename_t *)
                     CONCAT17(in_stack_ffffffffffffff07,
                              CONCAT16(in_stack_ffffffffffffff06,
                                       CONCAT24(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00)
                                      )));
    in_stack_ffffffffffffff06 = in_stack_ffffffffffffff07 ^ 0xff;
    std::__cxx11::string::~string(local_48);
    uVar2 = std::allocator<char>::~allocator((allocator<char> *)&local_49);
    if ((in_stack_ffffffffffffff06 & 1) != 0) break;
    os::sleep_for_millis
              (CONCAT13(in_stack_ffffffffffffff07,
                        CONCAT12(in_stack_ffffffffffffff06,in_stack_ffffffffffffff04)));
    local_24 = local_24 + 1;
  }
  return (int)CONCAT71((int7)((ulong)uVar2 >> 8),in_stack_ffffffffffffff06);
}

Assistant:

void open(const filename_t &fname, bool truncate = false)
    {
        close();
        auto *mode = truncate ? SPDLOG_FILENAME_T("wb") : SPDLOG_FILENAME_T("ab");
        _filename = fname;
        for (int tries = 0; tries < open_tries; ++tries)
        {
            if (!os::fopen_s(&fd_, fname, mode))
            {
                return;
            }

            details::os::sleep_for_millis(open_interval);
        }

        throw spdlog_ex("Failed opening file " + os::filename_to_str(_filename) + " for writing", errno);
    }